

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O2

void finishCcall(lua_State *L,int status)

{
  ushort uVar1;
  int iVar2;
  CallInfo *ci;
  int *piVar3;
  int nres;
  
  ci = L->ci;
  if (((ci->u).l.base == (StkId)0x0) || (L->nny != 0)) {
    __assert_fail("ci->u.c.k != ((void*)0) && L->nny == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                  ,0x274,"void finishCcall(lua_State *, int)");
  }
  uVar1 = ci->callstatus;
  if ((status != 1) && ((uVar1 & 0x10) == 0)) {
    __assert_fail("(ci->callstatus & (1<<4)) || status == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                  ,0x276,"void finishCcall(lua_State *, int)");
  }
  if ((uVar1 & 0x10) != 0) {
    ci->callstatus = uVar1 & 0xffef;
    L->errfunc = (ptrdiff_t)(ci->u).l.savedpc;
  }
  if ((ci->nresults == -1) && (ci->top < L->top)) {
    ci->top = L->top;
  }
  piVar3 = *(int **)&L[-1].hookmask;
  *piVar3 = *piVar3 + -1;
  if (*piVar3 != 0) {
    __assert_fail("--(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock) == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                  ,0x27e,"void finishCcall(lua_State *, int)");
  }
  nres = (*(ci->u).c.k)(L,status,(ci->u).c.ctx);
  iVar2 = **(int **)&L[-1].hookmask;
  **(int **)&L[-1].hookmask = iVar2 + 1;
  if (iVar2 != 0) {
    __assert_fail("(*((struct L_EXTRA*)(((void *)((char *)(L) - sizeof(struct L_EXTRA)))))->plock)++ == 0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                  ,0x280,"void finishCcall(lua_State *, int)");
  }
  if ((long)nres < (long)L->top - (long)L->ci->func >> 4) {
    luaD_poscall(L,ci,L->top + -(long)nres,nres);
    return;
  }
  __assert_fail("((n) < (L->top - L->ci->func)) && \"not enough elements in the stack\"",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ldo.c"
                ,0x281,"void finishCcall(lua_State *, int)");
}

Assistant:

static void finishCcall (lua_State *L, int status) {
  CallInfo *ci = L->ci;
  int n;
  /* must have a continuation and must be able to call it */
  lua_assert(ci->u.c.k != NULL && L->nny == 0);
  /* error status can only happen in a protected call */
  lua_assert((ci->callstatus & CIST_YPCALL) || status == LUA_YIELD);
  if (ci->callstatus & CIST_YPCALL) {  /* was inside a pcall? */
    ci->callstatus &= ~CIST_YPCALL;  /* continuation is also inside it */
    L->errfunc = ci->u.c.old_errfunc;  /* with the same error function */
  }
  /* finish 'lua_callk'/'lua_pcall'; CIST_YPCALL and 'errfunc' already
     handled */
  adjustresults(L, ci->nresults);
  lua_unlock(L);
  n = (*ci->u.c.k)(L, status, ci->u.c.ctx);  /* call continuation function */
  lua_lock(L);
  api_checknelems(L, n);
  luaD_poscall(L, ci, L->top - n, n);  /* finish 'luaD_precall' */
}